

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomp.c
# Opt level: O3

void ddb(Integer ndims,Integer *ardims,Integer npes,Integer *blk,Integer *pedims)

{
  Integer *pIVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  long lVar4;
  Integer *ardims_00;
  Integer *blk_00;
  Integer *pedims_00;
  long lVar5;
  ulong uVar6;
  size_t __nmemb;
  Integer IVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  if (0 < ndims) {
    __nmemb = 0;
    IVar7 = ndims;
    do {
      lVar8 = IVar7 + -1;
      lVar4 = blk[IVar7 + -1];
      if (lVar4 < 1) {
        pedims[lVar8] = -1;
        __nmemb = __nmemb + 1;
      }
      else {
        lVar4 = (ardims[lVar8] + lVar4 + -1) / lVar4;
        if (npes < lVar4) {
          pedims[lVar8] = npes;
          npes = 1;
        }
        else {
          lVar5 = lVar4;
          if (lVar4 < npes) {
            do {
              lVar5 = lVar4;
              if (npes % lVar4 == 0) break;
              lVar4 = lVar4 + 1;
              lVar5 = npes;
            } while (npes != lVar4);
          }
          pedims[lVar8] = lVar5;
          npes = npes / lVar5;
        }
      }
      bVar2 = 1 < IVar7;
      IVar7 = lVar8;
    } while (bVar2);
    if ((long)__nmemb < 1) {
      if (0 < ndims) {
        lVar4 = 0;
        do {
          if (pedims[lVar4] < 0) {
            pedims[lVar4] = 1;
          }
          lVar4 = lVar4 + 1;
        } while (ndims != lVar4);
      }
    }
    else {
      ardims_00 = (Integer *)calloc(__nmemb,8);
      if (((ardims_00 != (Integer *)0x0) &&
          (blk_00 = (Integer *)calloc(__nmemb,8), blk_00 != (Integer *)0x0)) &&
         (pedims_00 = (Integer *)calloc(__nmemb,8), auVar3 = _DAT_001b31e0,
         pedims_00 != (Integer *)0x0)) {
        lVar4 = __nmemb - 1;
        auVar9._8_4_ = (int)lVar4;
        auVar9._0_8_ = lVar4;
        auVar9._12_4_ = (int)((ulong)lVar4 >> 0x20);
        uVar6 = 0;
        auVar9 = auVar9 ^ _DAT_001b31e0;
        auVar10 = _DAT_001b31d0;
        do {
          auVar11 = auVar10 ^ auVar3;
          if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                      auVar9._4_4_ < auVar11._4_4_) & 1)) {
            blk_00[uVar6] = 1;
          }
          if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
              auVar11._12_4_ <= auVar9._12_4_) {
            blk_00[uVar6 + 1] = 1;
          }
          uVar6 = uVar6 + 2;
          lVar4 = auVar10._8_8_;
          auVar10._0_8_ = auVar10._0_8_ + 2;
          auVar10._8_8_ = lVar4 + 2;
        } while ((__nmemb + 1 & 0xfffffffffffffffe) != uVar6);
        if (ndims < 1) {
          ddb_h2(__nmemb,ardims_00,npes,0.1,0,blk_00,pedims_00);
        }
        else {
          lVar8 = 0;
          lVar4 = 0;
          do {
            if (pedims[lVar4] < 0) {
              ardims_00[lVar8] = ardims[lVar4];
              lVar8 = lVar8 + 1;
            }
            lVar4 = lVar4 + 1;
          } while (ndims != lVar4);
          ddb_h2(__nmemb,ardims_00,npes,0.1,0,blk_00,pedims_00);
          if (0 < ndims) {
            lVar4 = 0;
            lVar8 = 0;
            do {
              if (pedims[lVar8] < 0) {
                blk[lVar8] = (ardims_00[lVar4] + pedims_00[lVar4] + -1) / pedims_00[lVar4];
                lVar4 = lVar4 + 1;
              }
              lVar8 = lVar8 + 1;
            } while (ndims != lVar8);
            if (0 < ndims) {
              lVar4 = 0;
              lVar8 = 0;
              do {
                if (pedims[lVar8] < 0) {
                  pIVar1 = pedims_00 + lVar4;
                  lVar4 = lVar4 + 1;
                  pedims[lVar8] = *pIVar1;
                }
                lVar8 = lVar8 + 1;
              } while (ndims != lVar8);
            }
          }
        }
        free(pedims_00);
        free(blk_00);
        free(ardims_00);
        return;
      }
      fwrite("ddb: Memory allocation failed\n",0x1e,1,_stderr);
      if (0 < ndims) {
        memset(pedims,0,ndims << 3);
        return;
      }
    }
  }
  return;
}

Assistant:

void ddb(Integer ndims, Integer ardims[], Integer npes, Integer blk[],
         Integer pedims[])
{
    double ddb_threshold = 0.1;
    long ddb_bias = 0;
    long i, j;
    Integer count = 0;
    Integer *tardim, *tblk, *tpedim;
    long tp, sp;

    tp = (long)npes;

    /* count how many axes have <don't care> block values.*/
    for(i=ndims-1;i>=0;i--){
       if(blk[i]<=0){
          pedims[i] = -1;
          count += 1;
       } else {
          sp = (long)(ardims[i]+blk[i]-1)/blk[i];
          if(sp>tp) {
             sp = tp; tp = 1;
             pedims[i] = (Integer)sp;
          } else {
             for(j=sp;j<tp&&(tp%j!=0);j++);
             pedims[i] = (Integer)j;
             tp = tp / j;
          }
       }
    }

    if(count>0){
       tardim = (Integer *) calloc((size_t)count,sizeof(Integer));
       if(tardim==NULL) {
         fprintf(stderr,"ddb: Memory allocation failed\n");
         for(i=0;i<ndims;i++) pedims[i] = 0;
         return;
       }
       tblk = (Integer *) calloc((size_t)count,sizeof(Integer));
       if(tblk==NULL) {
          fprintf(stderr,"ddb: Memory allocation failed\n");
          for(i=0;i<ndims;i++) pedims[i] = 0;
          return;
       }
       tpedim = (Integer *) calloc((size_t)count,sizeof(Integer));
       if(tpedim==NULL) {
          fprintf(stderr,"ddb: Memory allocation failed\n");
          for(i=0;i<ndims;i++) pedims[i] = 0;
          return;
       }

       for(i=0;i<count;i++) tblk[i] = 1;
       for(i=0,j=0;j<ndims;j++) 
          if(pedims[j]<0) tardim[i++] = ardims[j];

       ddb_h2( count, tardim, (Integer)tp, ddb_threshold, ddb_bias, tblk, tpedim);
       /* ddb_h1( count, tardim, tp, ddb_threshold, tblk, tpedim); */

       for(i=0,j=0;j<ndims;j++)
          if(pedims[j]<0){
             blk[j] = (tardim[i]+tpedim[i]-1)/tpedim[i];
             i = i+1;
          }

       for(i=0,j=0;j<ndims;j++)
          if(pedims[j]<0) pedims[j] = tpedim[i++];

       free( tpedim ); 
       free( tblk ); 
       free( tardim ); 
    } else {
       for(j=0;j<ndims;j++)
          if(pedims[j]<0) pedims[j] = 1;
    }

}